

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rpc.c++
# Opt level: O0

Request<capnp::AnyPointer,_capnp::AnyPointer> * __thiscall
capnp::_::anon_unknown_0::RpcConnectionState::NoInterceptClient::newCall
          (Request<capnp::AnyPointer,_capnp::AnyPointer> *__return_storage_ptr__,
          NoInterceptClient *this,uint64_t interfaceId,uint16_t methodId,
          Maybe<capnp::MessageSize> *sizeHint)

{
  uint16_t methodId_00;
  uint64_t interfaceId_00;
  RpcClient *this_00;
  Maybe<capnp::MessageSize> local_48;
  Maybe<capnp::MessageSize> *local_30;
  Maybe<capnp::MessageSize> *sizeHint_local;
  uint64_t uStack_20;
  uint16_t methodId_local;
  uint64_t interfaceId_local;
  NoInterceptClient *this_local;
  
  local_30 = sizeHint;
  sizeHint_local._6_2_ = methodId;
  uStack_20 = interfaceId;
  interfaceId_local = (uint64_t)this;
  this_local = (NoInterceptClient *)__return_storage_ptr__;
  this_00 = kj::Own<capnp::_::(anonymous_namespace)::RpcConnectionState::RpcClient>::operator->
                      (&this->inner);
  interfaceId_00 = uStack_20;
  methodId_00 = sizeHint_local._6_2_;
  kj::Maybe<capnp::MessageSize>::Maybe(&local_48,sizeHint);
  RpcClient::newCallNoIntercept(__return_storage_ptr__,this_00,interfaceId_00,methodId_00,&local_48)
  ;
  kj::Maybe<capnp::MessageSize>::~Maybe(&local_48);
  return __return_storage_ptr__;
}

Assistant:

Request<AnyPointer, AnyPointer> newCall(
        uint64_t interfaceId, uint16_t methodId, kj::Maybe<MessageSize> sizeHint) override {
      return inner->newCallNoIntercept(interfaceId, methodId, sizeHint);
    }